

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O0

int xmlSchemaGetCanonValue(xmlSchemaValPtr val,xmlChar **retValue)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  xmlSchemaValPtr pxVar6;
  xmlChar *pxVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_stack_fffffffffffffd98;
  undefined4 uVar13;
  undefined8 in_stack_fffffffffffffda0;
  undefined4 uVar14;
  xmlChar local_228 [8];
  char buf_7 [40];
  xmlChar local_1f8 [8];
  char buf_6 [30];
  xmlSchemaValPtr norm_2;
  char buf_5 [50];
  xmlSchemaValPtr norm_1;
  char buf_4 [30];
  xmlSchemaValPtr norm;
  char buf_3 [30];
  char buf_2 [35];
  xmlChar local_108 [8];
  char buf_1 [30];
  double left;
  double sec;
  unsigned_long min;
  unsigned_long hour;
  unsigned_long day;
  unsigned_long mon;
  unsigned_long year;
  char buf [100];
  size_t local_38;
  size_t bufSize;
  xmlChar *start_1;
  xmlChar *start;
  xmlChar **retValue_local;
  xmlSchemaValPtr val_local;
  
  uVar14 = (undefined4)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  if ((retValue == (xmlChar **)0x0) || (val == (xmlSchemaValPtr)0x0)) {
    val_local._4_4_ = -1;
  }
  else {
    *retValue = (xmlChar *)0x0;
    switch(val->type) {
    case XML_SCHEMAS_STRING:
      if ((val->value).decimal.str == (xmlChar *)0x0) {
        pxVar7 = xmlStrdup("");
        *retValue = pxVar7;
      }
      else {
        pxVar7 = xmlStrdup((val->value).decimal.str);
        *retValue = pxVar7;
      }
      break;
    case XML_SCHEMAS_NORMSTRING:
      if ((val->value).decimal.str == (xmlChar *)0x0) {
        pxVar7 = xmlStrdup("");
        *retValue = pxVar7;
      }
      else {
        pxVar7 = xmlSchemaWhiteSpaceReplace((val->value).decimal.str);
        *retValue = pxVar7;
        if (*retValue == (xmlChar *)0x0) {
          pxVar7 = xmlStrdup((val->value).decimal.str);
          *retValue = pxVar7;
        }
      }
      break;
    case XML_SCHEMAS_DECIMAL:
      start_1 = (val->value).decimal.str;
      if (*start_1 == '+') {
        start_1 = start_1 + 1;
      }
      pxVar7 = xmlStrdup(start_1);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_TIME:
      if ((*(ushort *)((long)&val->value + 0x18) & 1) == 0) {
        snprintf((char *)&norm,0x1e,"%02u:%02u:%02.14g",(val->value).date.sec,
                 (ulong)((val->value).decimal.integralPlaces >> 9 & 0x1f),
                 (ulong)((val->value).decimal.integralPlaces >> 0xe & 0x3f));
      }
      else {
        pxVar6 = xmlSchemaDateNormalize(val,0.0);
        if (pxVar6 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        snprintf((char *)&norm,0x1e,"%02u:%02u:%02.14gZ",(pxVar6->value).date.sec,
                 (ulong)((pxVar6->value).decimal.integralPlaces >> 9 & 0x1f),
                 (ulong)((pxVar6->value).decimal.integralPlaces >> 0xe & 0x3f));
        xmlSchemaFreeValue(pxVar6);
      }
      pxVar7 = xmlStrdup((xmlChar *)&norm);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_GDAY:
      pxVar7 = (xmlChar *)(*xmlMalloc)(6);
      *retValue = pxVar7;
      if (*retValue == (xmlChar *)0x0) {
        return -1;
      }
      snprintf((char *)*retValue,6,"---%02u",
               (ulong)((val->value).decimal.integralPlaces >> 4 & 0x1f));
      break;
    case XML_SCHEMAS_GMONTH:
      pxVar7 = (xmlChar *)(*xmlMalloc)(6);
      *retValue = pxVar7;
      if (*retValue == (xmlChar *)0x0) {
        return -1;
      }
      snprintf((char *)*retValue,6,"--%02u",(ulong)((val->value).decimal.integralPlaces & 0xf));
      break;
    case XML_SCHEMAS_GMONTHDAY:
      pxVar7 = (xmlChar *)(*xmlMalloc)(8);
      *retValue = pxVar7;
      if (*retValue == (xmlChar *)0x0) {
        return -1;
      }
      snprintf((char *)*retValue,8,"--%02u-%02u",(ulong)((val->value).decimal.integralPlaces & 0xf),
               (ulong)((val->value).decimal.integralPlaces >> 4 & 0x1f));
      break;
    case XML_SCHEMAS_GYEAR:
      snprintf((char *)local_108,0x1e,"%04ld",(val->value).decimal.str);
      pxVar7 = xmlStrdup(local_108);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_GYEARMONTH:
      if ((val->value).date.year < 0) {
        lVar3 = (val->value).date.year;
        if (lVar3 < 1) {
          lVar3 = -lVar3;
        }
        snprintf(buf_3 + 0x18,0x23,"-%04ld-%02u",lVar3,
                 (ulong)((val->value).decimal.integralPlaces & 0xf));
      }
      else {
        snprintf(buf_3 + 0x18,0x23,"%04ld-%02u",(val->value).decimal.str,
                 (ulong)((val->value).decimal.integralPlaces & 0xf));
      }
      pxVar7 = xmlStrdup((xmlChar *)(buf_3 + 0x18));
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_DATE:
      if ((*(ushort *)((long)&val->value + 0x18) & 1) == 0) {
        snprintf((char *)&norm_1,0x1e,"%04ld-%02u-%02u",(val->value).decimal.str,
                 (ulong)((val->value).decimal.integralPlaces & 0xf),
                 (ulong)((val->value).decimal.integralPlaces >> 4 & 0x1f));
      }
      else {
        register0x00000000 = xmlSchemaDateNormalize(val,0.0);
        if (register0x00000000 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        snprintf((char *)&norm_1,0x1e,"%04ld-%02u-%02uZ",(register0x00000000->value).decimal.str,
                 (ulong)((register0x00000000->value).decimal.integralPlaces & 0xf),
                 (ulong)((register0x00000000->value).decimal.integralPlaces >> 4 & 0x1f));
        xmlSchemaFreeValue(stack0xfffffffffffffe70);
      }
      pxVar7 = xmlStrdup((xmlChar *)&norm_1);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_DATETIME:
      if ((*(ushort *)((long)&val->value + 0x18) & 1) == 0) {
        snprintf((char *)&norm_2,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14g",(val->value).date.sec,
                 (val->value).decimal.str,(ulong)((val->value).decimal.integralPlaces & 0xf),
                 (ulong)((val->value).decimal.integralPlaces >> 4 & 0x1f),
                 CONCAT44(uVar13,(val->value).decimal.integralPlaces >> 9) & 0xffffffff0000001f,
                 CONCAT44(uVar14,(val->value).decimal.integralPlaces >> 0xe) & 0xffffffff0000003f);
      }
      else {
        pxVar6 = xmlSchemaDateNormalize(val,0.0);
        if (pxVar6 == (xmlSchemaValPtr)0x0) {
          return -1;
        }
        snprintf((char *)&norm_2,0x32,"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",(pxVar6->value).date.sec,
                 (pxVar6->value).decimal.str,(ulong)((pxVar6->value).decimal.integralPlaces & 0xf),
                 (ulong)((pxVar6->value).decimal.integralPlaces >> 4 & 0x1f),
                 CONCAT44(uVar13,(pxVar6->value).decimal.integralPlaces >> 9) & 0xffffffff0000001f,
                 CONCAT44(uVar14,(pxVar6->value).decimal.integralPlaces >> 0xe) & 0xffffffff0000003f
                );
        xmlSchemaFreeValue(pxVar6);
      }
      pxVar7 = xmlStrdup((xmlChar *)&norm_2);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_DURATION:
      min = 0;
      sec = 0.0;
      left = 0.0;
      lVar3 = (val->value).date.year;
      if (lVar3 < 1) {
        lVar3 = -lVar3;
      }
      dVar8 = floor((double)lVar3 / 12.0);
      uVar2 = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
      lVar3 = (val->value).date.year;
      if (lVar3 < 1) {
        lVar3 = -lVar3;
      }
      lVar3 = lVar3 + uVar2 * -0xc;
      dVar8 = floor(ABS((val->value).date.sec) / 86400.0);
      uVar4 = (long)dVar8 | (long)(dVar8 - 9.223372036854776e+18) & (long)dVar8 >> 0x3f;
      lVar5 = uVar4 * 0x15180;
      auVar10._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar10._0_8_ = lVar5;
      auVar10._12_4_ = 0x45300000;
      dVar8 = ABS((val->value).date.sec) -
              ((auVar10._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
      if (0.0 < dVar8) {
        dVar9 = floor(dVar8 / 3600.0);
        min = (long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f;
        lVar5 = min * 0xe10;
        auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar11._0_8_ = lVar5;
        auVar11._12_4_ = 0x45300000;
        dVar8 = dVar8 - ((auVar11._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
        if (0.0 < dVar8) {
          dVar9 = floor(dVar8 / 60.0);
          sec = (double)((long)dVar9 | (long)(dVar9 - 9.223372036854776e+18) & (long)dVar9 >> 0x3f);
          lVar5 = (long)sec * 0x3c;
          auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
          auVar12._0_8_ = lVar5;
          auVar12._12_4_ = 0x45300000;
          left = dVar8 - ((auVar12._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
        }
      }
      if (((val->value).date.year < 0) ||
         (pdVar1 = &(val->value).date.sec, *pdVar1 <= 0.0 && *pdVar1 != 0.0)) {
        snprintf((char *)&year,100,"P%luY%luM%luDT%luH%luM%.14gS",left,uVar2,lVar3,uVar4,min,sec);
      }
      else {
        snprintf((char *)&year,100,"-P%luY%luM%luDT%luH%luM%.14gS",left,uVar2,lVar3,uVar4,min,sec);
      }
      pxVar7 = xmlStrdup((xmlChar *)&year);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_FLOAT:
      snprintf((char *)local_1f8,0x1e,"%01.14e",(double)(val->value).f);
      pxVar7 = xmlStrdup(local_1f8);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_DOUBLE:
      snprintf((char *)local_228,0x28,"%01.14e",(val->value).decimal.str);
      pxVar7 = xmlStrdup(local_228);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_BOOLEAN:
      if ((val->value).b == 0) {
        pxVar7 = xmlStrdup((xmlChar *)"false");
        *retValue = pxVar7;
      }
      else {
        pxVar7 = xmlStrdup((xmlChar *)"true");
        *retValue = pxVar7;
      }
      break;
    case XML_SCHEMAS_TOKEN:
    case XML_SCHEMAS_LANGUAGE:
    case XML_SCHEMAS_NMTOKEN:
    case XML_SCHEMAS_NAME:
    case XML_SCHEMAS_NCNAME:
    case XML_SCHEMAS_ID:
    case XML_SCHEMAS_IDREF:
    case XML_SCHEMAS_ENTITY:
    case XML_SCHEMAS_NOTATION:
    case XML_SCHEMAS_ANYURI:
      if ((val->value).decimal.str == (xmlChar *)0x0) {
        return -1;
      }
      pxVar7 = xmlSchemaCollapseString((val->value).decimal.str);
      *retValue = pxVar7;
      if (*retValue == (xmlChar *)0x0) {
        pxVar7 = xmlStrdup((val->value).decimal.str);
        *retValue = pxVar7;
      }
      break;
    default:
      pxVar7 = xmlStrdup((xmlChar *)"???");
      *retValue = pxVar7;
      return 1;
    case XML_SCHEMAS_QNAME:
      if ((val->value).dur.day == 0) {
        pxVar7 = xmlStrdup((val->value).decimal.str);
        *retValue = pxVar7;
        return 0;
      }
      pxVar7 = xmlStrdup((xmlChar *)"{");
      *retValue = pxVar7;
      pxVar7 = xmlStrcat(*retValue,(val->value).qname.uri);
      *retValue = pxVar7;
      pxVar7 = xmlStrcat(*retValue,"}");
      *retValue = pxVar7;
      pxVar7 = xmlStrcat(*retValue,(val->value).qname.uri);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_INTEGER:
    case XML_SCHEMAS_NPINTEGER:
    case XML_SCHEMAS_NINTEGER:
    case XML_SCHEMAS_NNINTEGER:
    case XML_SCHEMAS_PINTEGER:
    case XML_SCHEMAS_INT:
    case XML_SCHEMAS_UINT:
    case XML_SCHEMAS_LONG:
    case XML_SCHEMAS_ULONG:
    case XML_SCHEMAS_SHORT:
    case XML_SCHEMAS_USHORT:
    case XML_SCHEMAS_BYTE:
    case XML_SCHEMAS_UBYTE:
      bufSize = (size_t)(val->value).decimal.str;
      local_38 = (size_t)((val->value).decimal.integralPlaces + 2);
      if (*(xmlChar *)bufSize == '+') {
        bufSize = bufSize + 1;
        local_38 = local_38 - 1;
      }
      pxVar7 = (xmlChar *)(*xmlMalloc)(local_38);
      *retValue = pxVar7;
      if (*retValue != (xmlChar *)0x0) {
        snprintf((char *)*retValue,local_38,"%s",bufSize);
      }
      break;
    case XML_SCHEMAS_HEXBINARY:
      pxVar7 = xmlStrdup((val->value).decimal.str);
      *retValue = pxVar7;
      break;
    case XML_SCHEMAS_BASE64BINARY:
      pxVar7 = xmlStrdup((val->value).decimal.str);
      *retValue = pxVar7;
    }
    if (*retValue == (xmlChar *)0x0) {
      val_local._4_4_ = -1;
    }
    else {
      val_local._4_4_ = 0;
    }
  }
  return val_local._4_4_;
}

Assistant:

int
xmlSchemaGetCanonValue(xmlSchemaValPtr val, const xmlChar **retValue)
{
    if ((retValue == NULL) || (val == NULL))
	return (-1);
    *retValue = NULL;
    switch (val->type) {
	case XML_SCHEMAS_STRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_NORMSTRING:
	    if (val->value.str == NULL)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "");
	    else {
		*retValue = xmlSchemaWhiteSpaceReplace(
		    (const xmlChar *) val->value.str);
		if ((*retValue) == NULL)
		    *retValue = BAD_CAST xmlStrdup(
			(const xmlChar *) val->value.str);
	    }
	    break;
	case XML_SCHEMAS_TOKEN:
	case XML_SCHEMAS_LANGUAGE:
	case XML_SCHEMAS_NMTOKEN:
	case XML_SCHEMAS_NAME:
	case XML_SCHEMAS_NCNAME:
	case XML_SCHEMAS_ID:
	case XML_SCHEMAS_IDREF:
	case XML_SCHEMAS_ENTITY:
	case XML_SCHEMAS_NOTATION: /* Unclear */
	case XML_SCHEMAS_ANYURI:   /* Unclear */
	    if (val->value.str == NULL)
		return (-1);
	    *retValue =
		BAD_CAST xmlSchemaCollapseString(BAD_CAST val->value.str);
	    if (*retValue == NULL)
		*retValue =
		    BAD_CAST xmlStrdup((const xmlChar *) val->value.str);
	    break;
	case XML_SCHEMAS_QNAME:
	    /* TODO: Unclear in XML Schema 1.0. */
	    if (val->value.qname.uri == NULL) {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.qname.name);
		return (0);
	    } else {
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "{");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST "}");
		*retValue = BAD_CAST xmlStrcat((xmlChar *) (*retValue),
		    BAD_CAST val->value.qname.uri);
	    }
	    break;
	case XML_SCHEMAS_DECIMAL: {
                xmlChar *start = val->value.decimal.str;
                if(start[0] == '+')
                {
                    start += 1;
                }
                *retValue = xmlStrdup(start);
	    }
	    break;
	case XML_SCHEMAS_INTEGER:
        case XML_SCHEMAS_PINTEGER:
        case XML_SCHEMAS_NPINTEGER:
        case XML_SCHEMAS_NINTEGER:
        case XML_SCHEMAS_NNINTEGER:
	case XML_SCHEMAS_LONG:
        case XML_SCHEMAS_BYTE:
        case XML_SCHEMAS_SHORT:
        case XML_SCHEMAS_INT:
	case XML_SCHEMAS_UINT:
        case XML_SCHEMAS_ULONG:
        case XML_SCHEMAS_USHORT:
        case XML_SCHEMAS_UBYTE: {
            xmlChar *start = val->value.decimal.str;
            /* 2 = sign+NULL */
            size_t bufSize = val->value.decimal.integralPlaces+2;
            if(start[0] == '+')
            {
                start += 1;
                bufSize -= 1;
            }
            *retValue = xmlMalloc(bufSize);
            if(*retValue) {
                /* no need to limit string length in format, it will only print bufSize-1 chars anyways */
                snprintf((char*)*retValue, bufSize, "%s", start);
            }
	    }
	    break;
	case XML_SCHEMAS_BOOLEAN:
	    if (val->value.b)
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "true");
	    else
		*retValue = BAD_CAST xmlStrdup(BAD_CAST "false");
	    break;
	case XML_SCHEMAS_DURATION: {
		char buf[100];
		unsigned long year;
		unsigned long mon, day, hour = 0, min = 0;
		double sec = 0, left;

		/* TODO: Unclear in XML Schema 1.0 */
		/*
		* TODO: This results in a normalized output of the value
		* - which is NOT conformant to the spec -
		* since the exact values of each property are not
		* recoverable. Think about extending the structure to
		* provide a field for every property.
		*/
		year = (unsigned long) FQUOTIENT(labs(val->value.dur.mon), 12);
		mon = labs(val->value.dur.mon) - 12 * year;

		day = (unsigned long) FQUOTIENT(fabs(val->value.dur.sec), 86400);
		left = fabs(val->value.dur.sec) - day * 86400;
		if (left > 0) {
		    hour = (unsigned long) FQUOTIENT(left, 3600);
		    left = left - (hour * 3600);
		    if (left > 0) {
			min = (unsigned long) FQUOTIENT(left, 60);
			sec = left - (min * 60);
		    }
		}
		if ((val->value.dur.mon < 0) || (val->value.dur.sec < 0))
		    snprintf(buf, 100, "P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		else
		    snprintf(buf, 100, "-P%luY%luM%luDT%luH%luM%.14gS",
			year, mon, day, hour, min, sec);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GYEAR: {
		char buf[30];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		snprintf(buf, 30, "%04ld", val->value.date.year);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_GMONTH: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "--%02u",
		    val->value.date.mon);
	    }
	    break;
        case XML_SCHEMAS_GDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(6);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 6, "---%02u",
		    val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GMONTHDAY: {
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		*retValue = xmlMalloc(8);
		if (*retValue == NULL)
		    return(-1);
		snprintf((char *) *retValue, 8, "--%02u-%02u",
		    val->value.date.mon, val->value.date.day);
	    }
	    break;
        case XML_SCHEMAS_GYEARMONTH: {
		char buf[35];
		/* TODO: Unclear in XML Schema 1.0 */
		/* TODO: What to do with the timezone? */
		if (val->value.date.year < 0)
		    snprintf(buf, 35, "-%04ld-%02u",
			labs(val->value.date.year),
			val->value.date.mon);
		else
		    snprintf(buf, 35, "%04ld-%02u",
			val->value.date.year, val->value.date.mon);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_TIME:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 30,
			"%02u:%02u:%02.14gZ",
			norm->value.date.hour,
			norm->value.date.min,
			norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%02u:%02u:%02.14g",
			val->value.date.hour,
			val->value.date.min,
			val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATE:
	    {
		char buf[30];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Append the canonical value of the
		    * recoverable timezone and not "Z".
		    */
		    snprintf(buf, 30,
			"%04ld-%02u-%02uZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 30,
			"%04ld-%02u-%02u",
			val->value.date.year, val->value.date.mon,
			val->value.date.day);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
        case XML_SCHEMAS_DATETIME:
	    {
		char buf[50];

		if (val->value.date.tz_flag) {
		    xmlSchemaValPtr norm;

		    norm = xmlSchemaDateNormalize(val, 0);
		    if (norm == NULL)
			return (-1);
		    /*
		    * TODO: Check if "%.14g" is portable.
		    */
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14gZ",
			norm->value.date.year, norm->value.date.mon,
			norm->value.date.day, norm->value.date.hour,
			norm->value.date.min, norm->value.date.sec);
		    xmlSchemaFreeValue(norm);
		} else {
		    snprintf(buf, 50,
			"%04ld-%02u-%02uT%02u:%02u:%02.14g",
			val->value.date.year, val->value.date.mon,
			val->value.date.day, val->value.date.hour,
			val->value.date.min, val->value.date.sec);
		}
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_HEXBINARY:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.hex.str);
	    break;
	case XML_SCHEMAS_BASE64BINARY:
	    /*
	    * TODO: Is the following spec piece implemented?:
	    * SPEC: "Note: For some values the canonical form defined
	    * above does not conform to [RFC 2045], which requires breaking
	    * with linefeeds at appropriate intervals."
	    */
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST val->value.base64.str);
	    break;
	case XML_SCHEMAS_FLOAT: {
		char buf[30];
		/*
		* |m| < 16777216, -149 <= e <= 104.
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 30, "%01.14e", val->value.f);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	case XML_SCHEMAS_DOUBLE: {
		char buf[40];
		/* |m| < 9007199254740992, -1075 <= e <= 970 */
		/*
		* TODO: Handle, NaN, INF, -INF. The format is not
		* yet conformant. The c type float does not cover
		* the whole range.
		*/
		snprintf(buf, 40, "%01.14e", val->value.d);
		*retValue = BAD_CAST xmlStrdup(BAD_CAST buf);
	    }
	    break;
	default:
	    *retValue = BAD_CAST xmlStrdup(BAD_CAST "???");
	    return (1);
    }
    if (*retValue == NULL)
	return(-1);
    return (0);
}